

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d4c.cpp
# Opt level: O2

void anon_unknown.dwarf_4a44::GetCentroid
               (double *x,int x_length,int fs,double current_f0,int fft_size,double current_position
               ,ForwardRealFFT *forward_real_fft,double *centroid,RandnState *randn_state)

{
  double *waveform;
  fft_complex *padVar1;
  int iVar2;
  ulong uVar3;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  fft_plan *pfVar7;
  undefined8 *puVar8;
  int i;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  byte bVar12;
  double x_00;
  double dVar13;
  fft_plan in_stack_ffffffffffffff68;
  double local_48;
  
  bVar12 = 0;
  uVar3 = 0;
  uVar10 = 0;
  if (0 < fft_size) {
    uVar10 = (ulong)(uint)fft_size;
  }
  waveform = forward_real_fft->waveform;
  for (; uVar10 != uVar3; uVar3 = uVar3 + 1) {
    waveform[uVar3] = 0.0;
  }
  GetWindowedWaveform(x,x_length,fs,current_f0,current_position,2,4.0,waveform,randn_state);
  x_00 = ((double)fs + (double)fs) / current_f0;
  local_48 = 0.0;
  lVar9 = 0;
  while( true ) {
    iVar2 = matlab_round(x_00);
    if (iVar2 * 2 < lVar9) break;
    local_48 = local_48 + forward_real_fft->waveform[lVar9] * forward_real_fft->waveform[lVar9];
    lVar9 = lVar9 + 1;
  }
  lVar9 = 0;
  while( true ) {
    iVar2 = matlab_round(x_00);
    if (iVar2 * 2 < lVar9) break;
    dVar13 = SQRT(local_48);
    if (local_48 < 0.0) {
      dVar13 = sqrt(local_48);
    }
    forward_real_fft->waveform[lVar9] = forward_real_fft->waveform[lVar9] / dVar13;
    lVar9 = lVar9 + 1;
  }
  pfVar7 = &forward_real_fft->forward_fft;
  puVar8 = (undefined8 *)&stack0xffffffffffffff68;
  for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
    *puVar8 = *(undefined8 *)pfVar7;
    pfVar7 = (fft_plan *)((long)pfVar7 + (ulong)bVar12 * -0x10 + 8);
    puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
  }
  fft_execute(in_stack_ffffffffffffff68);
  uVar11 = fft_size / 2 + 1;
  uVar3 = 0xffffffffffffffff;
  if (-4 < fft_size) {
    uVar3 = (long)(fft_size / 2) * 8 + 8;
  }
  pvVar4 = operator_new__(uVar3);
  pvVar5 = operator_new__(uVar3);
  uVar6 = 0;
  uVar3 = (ulong)uVar11;
  if ((int)uVar11 < 1) {
    uVar3 = uVar6;
  }
  for (; uVar3 * 8 != uVar6; uVar6 = uVar6 + 8) {
    padVar1 = forward_real_fft->spectrum;
    *(undefined8 *)((long)pvVar4 + uVar6) = *(undefined8 *)((long)*padVar1 + uVar6 * 2);
    *(undefined8 *)((long)pvVar5 + uVar6) = *(undefined8 *)((long)*padVar1 + uVar6 * 2 + 8);
  }
  uVar6 = 0;
  while (uVar10 != uVar6) {
    forward_real_fft->waveform[uVar6] = (double)(int)(uVar6 + 1) * forward_real_fft->waveform[uVar6]
    ;
    uVar6 = uVar6 + 1;
  }
  pfVar7 = &forward_real_fft->forward_fft;
  puVar8 = (undefined8 *)&stack0xffffffffffffff68;
  for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
    *puVar8 = *(undefined8 *)pfVar7;
    pfVar7 = (fft_plan *)((long)pfVar7 + (ulong)bVar12 * -0x10 + 8);
    puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
  }
  fft_execute(in_stack_ffffffffffffff68);
  for (uVar10 = 0; uVar3 * 8 != uVar10; uVar10 = uVar10 + 8) {
    *(double *)((long)centroid + uVar10) =
         *(double *)((long)*forward_real_fft->spectrum + uVar10 * 2) *
         *(double *)((long)pvVar4 + uVar10) +
         *(double *)((long)pvVar5 + uVar10) *
         *(double *)((long)*forward_real_fft->spectrum + uVar10 * 2 + 8);
  }
  operator_delete__(pvVar4);
  operator_delete__(pvVar5);
  return;
}

Assistant:

static void GetCentroid(const double *x, int x_length, int fs,
    double current_f0, int fft_size, double current_position,
    const ForwardRealFFT *forward_real_fft, double *centroid,
    RandnState *randn_state) {
  for (int i = 0; i < fft_size; ++i) forward_real_fft->waveform[i] = 0.0;
  GetWindowedWaveform(x, x_length, fs, current_f0,
      current_position, world::kBlackman, 4.0, forward_real_fft->waveform, randn_state);
  double power = 0.0;
  for (int i = 0; i <= matlab_round(2.0 * fs / current_f0) * 2; ++i)
    power += forward_real_fft->waveform[i] * forward_real_fft->waveform[i];
  for (int i = 0; i <= matlab_round(2.0 * fs / current_f0) * 2; ++i)
    forward_real_fft->waveform[i] /= sqrt(power);

  fft_execute(forward_real_fft->forward_fft);
  double *tmp_real = new double[fft_size / 2 + 1];
  double *tmp_imag = new double[fft_size / 2 + 1];
  for (int i = 0; i <= fft_size / 2; ++i) {
    tmp_real[i] = forward_real_fft->spectrum[i][0];
    tmp_imag[i] = forward_real_fft->spectrum[i][1];
  }

  for (int i = 0; i < fft_size; ++i)
    forward_real_fft->waveform[i] *= i + 1.0;
  fft_execute(forward_real_fft->forward_fft);
  for (int i = 0; i <= fft_size / 2; ++i)
    centroid[i] = forward_real_fft->spectrum[i][0] * tmp_real[i] +
      tmp_imag[i] * forward_real_fft->spectrum[i][1];

  delete[] tmp_real;
  delete[] tmp_imag;
}